

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcProject::~IfcProject(IfcProject *this,void **vtt)

{
  void *pvVar1;
  pointer pLVar2;
  pointer pcVar3;
  undefined1 *puVar4;
  
  pvVar1 = *vtt;
  *(void **)&this->super_IfcObject = pvVar1;
  *(void **)(&(this->super_IfcObject).field_0x0 + *(long *)((long)pvVar1 + -0x18)) = vtt[0x12];
  *(void **)&(this->super_IfcObject).field_0x88 = vtt[0x13];
  (this->super_IfcObject).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.
  _vptr_ObjectHelper = (_func_int **)vtt[0x14];
  *(void **)&(this->super_IfcObject).field_0xd0 = vtt[0x15];
  pLVar2 = (this->RepresentationContexts).
           super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationContext>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationContext>_>_>
           .
           super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationContext>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationContext>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pLVar2 != (pointer)0x0) {
    operator_delete(pLVar2);
  }
  pcVar3 = (this->Phase).ptr._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &(this->Phase).ptr.field_2) {
    operator_delete(pcVar3);
  }
  puVar4 = *(undefined1 **)&(this->super_IfcObject).field_0xe0;
  if (puVar4 != &this->field_0xf0) {
    operator_delete(puVar4);
  }
  pvVar1 = vtt[1];
  *(void **)&this->super_IfcObject = pvVar1;
  *(void **)(&(this->super_IfcObject).field_0x0 + *(long *)((long)pvVar1 + -0x18)) = vtt[0xd];
  *(void **)&(this->super_IfcObject).field_0x88 = vtt[0xe];
  (this->super_IfcObject).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.
  _vptr_ObjectHelper = (_func_int **)vtt[0xf];
  puVar4 = *(undefined1 **)
            &(this->super_IfcObject).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.
             field_0x10;
  if (puVar4 != &(this->super_IfcObject).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>
                 .field_0x20) {
    operator_delete(puVar4);
  }
  pvVar1 = vtt[3];
  *(void **)&this->super_IfcObject = pvVar1;
  *(void **)(&(this->super_IfcObject).field_0x0 + *(long *)((long)pvVar1 + -0x18)) = vtt[6];
  puVar4 = *(undefined1 **)&(this->super_IfcObject).field_0x60;
  if (puVar4 != &(this->super_IfcObject).field_0x70) {
    operator_delete(puVar4);
  }
  puVar4 = *(undefined1 **)&(this->super_IfcObject).field_0x38;
  if (puVar4 != &(this->super_IfcObject).field_0x48) {
    operator_delete(puVar4);
  }
  puVar4 = *(undefined1 **)&(this->super_IfcObject).field_0x10;
  if (puVar4 != &(this->super_IfcObject).field_0x20) {
    operator_delete(puVar4);
    return;
  }
  return;
}

Assistant:

IfcProject() : Object("IfcProject") {}